

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::areaNavigate(Player *this,int *x,int *y)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  bool bVar5;
  int recommendedHit [2];
  string local_50;
  
  *x = 1;
  *y = 1;
  UI::clearScreen();
  getName_abi_cxx11_(&local_50,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                       (int)local_50._M_dataplus._M_p),local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'s turn: ",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  printPointedEnemyArea(this,*x,*y);
  bVar1 = Keyboard::getche();
  if (this->role == true) {
    if (bVar1 != 0x65) {
      bVar5 = false;
      do {
        UI::clearScreen();
        getName_abi_cxx11_(&local_50,this);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                             (int)local_50._M_dataplus._M_p),
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'s turn: ",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        bVar4 = bVar5;
        if (bVar1 < 0x73) {
          if (bVar1 == 0x61) {
            if (1 < *y) {
              iVar2 = *y + -1;
              goto LAB_00103a6c;
            }
          }
          else {
            bVar4 = true;
            if ((bVar1 == 100) && (bVar4 = bVar5, *y < 10)) {
              iVar2 = *y + 1;
LAB_00103a6c:
              *y = iVar2;
              bVar4 = bVar5;
            }
          }
        }
        else if (bVar1 == 0x73) {
          if (*x < 10) {
            iVar2 = *x + 1;
            goto LAB_00103a7a;
          }
        }
        else {
          bVar4 = true;
          if ((bVar1 == 0x77) && (bVar4 = bVar5, 1 < *x)) {
            iVar2 = *x + -1;
LAB_00103a7a:
            *x = iVar2;
            bVar4 = bVar5;
          }
        }
        printPointedEnemyArea(this,*x,*y);
        if (bVar4) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          poVar3 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[ERROR] Wrong direction",0x17);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          bVar4 = false;
        }
        bVar1 = Keyboard::getche();
        bVar5 = bVar4;
      } while (bVar1 != 0x65);
    }
    UI::clearScreen();
  }
  else {
    AI::recommendHitForPlayer(this,(int *)&local_50);
    *x = (int)local_50._M_dataplus._M_p;
    *y = local_50._M_dataplus._M_p._4_4_;
  }
  return;
}

Assistant:

void Player::areaNavigate(int &x, int &y)
{
    char direction;
    x = 1; y = 1;
    UI::clearScreen();
    std::cout << getName() << "'s turn: " << std::endl;
    printPointedEnemyArea(x,y);
    direction = Keyboard::getche();
    if (!getRole()) //if computer plays
    {
        int recommendedHit[2];
        AI::recommendHitForPlayer(*this, recommendedHit);
        x = recommendedHit[0];
        y = recommendedHit[1];
        return;
    }
    bool errorOccured = false;
    while(direction != 'e')
    {
        UI::clearScreen();
        std::cout << getName() << "'s turn: " << std::endl;
        //std::cout << "|" << std::endl;
        switch(direction) {
            case 'w':
                if (x > 1) x--;
                break;
            case 'a':
                if (y > 1) y--;
                break;
            case 's':
                if (x < 10) x++;
                break;
            case 'd':
                if (y < 10) y++;
                break;

            default:
                errorOccured = true;

        }
        printPointedEnemyArea(x,y);
        if (errorOccured) {
            std::cout << std::endl << "[ERROR] Wrong direction" << std::endl;
            errorOccured = false;
        }
        //std::cout << (int) direction;
        direction = Keyboard::getche();
    }
//    UI::clearScreen();
//    std::cout << getName() << "'s turn: " << std::endl;
//    printPointedEnemyArea(x,y);
    //Keyboard::getch();
    UI::clearScreen();

}